

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::prepareTransformFeedback
          (FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x408))(1,&this->m_xfb_dsa);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x67d);
  return;
}

Assistant:

void FunctionalTest::prepareTransformFeedback()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* XFB object creation. */
	gl.createTransformFeedbacks(1, &m_xfb_dsa);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");
}